

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::LSTMParams::ByteSizeLong(LSTMParams *this)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  LSTMParams *this_local;
  
  sStack_18 = 0;
  fVar3 = cellclipthreshold(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    sStack_18 = 6;
  }
  bVar1 = sequenceoutput(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 2;
  }
  bVar1 = hasbiasvectors(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 3;
  }
  bVar1 = forgetbias(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 3;
  }
  bVar1 = haspeepholevectors(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 3;
  }
  bVar1 = coupledinputandforgetgate(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 3;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t LSTMParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LSTMParams)
  size_t total_size = 0;

  // float cellClipThreshold = 60;
  if (this->cellclipthreshold() != 0) {
    total_size += 2 + 4;
  }

  // bool sequenceOutput = 10;
  if (this->sequenceoutput() != 0) {
    total_size += 1 + 1;
  }

  // bool hasBiasVectors = 20;
  if (this->hasbiasvectors() != 0) {
    total_size += 2 + 1;
  }

  // bool forgetBias = 30;
  if (this->forgetbias() != 0) {
    total_size += 2 + 1;
  }

  // bool hasPeepholeVectors = 40;
  if (this->haspeepholevectors() != 0) {
    total_size += 2 + 1;
  }

  // bool coupledInputAndForgetGate = 50;
  if (this->coupledinputandforgetgate() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}